

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

char * cm_expat_XML_GetInputContext(XML_Parser parser,int *offset,int *size)

{
  int *size_local;
  int *offset_local;
  XML_Parser parser_local;
  
  if ((*(long *)((long)parser + 0x218) == 0) || (*(long *)((long)parser + 0x10) == 0)) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    *offset = (int)*(undefined8 *)((long)parser + 0x218) - (int)*(undefined8 *)((long)parser + 0x10)
    ;
    *size = (int)*(undefined8 *)((long)parser + 0x38) - (int)*(undefined8 *)((long)parser + 0x10);
    parser_local = *(XML_Parser *)((long)parser + 0x10);
  }
  return (char *)parser_local;
}

Assistant:

const char * XML_GetInputContext(XML_Parser parser, int *offset, int *size)
{
#ifdef XML_CONTEXT_BYTES
  if (eventPtr && buffer) {
    *offset = eventPtr - buffer;
    *size   = bufferEnd - buffer;
    return buffer;
  }
#endif /* defined XML_CONTEXT_BYTES */
  return (char *) 0;
}